

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimedExecution.h
# Opt level: O3

void nrg::TimedExecution::push<std::function<void()>>(Queue *queue,function<void_()> *fn)

{
  QueueElement local_70;
  rep local_48;
  undefined8 local_40;
  undefined8 uStack_38;
  code *local_30;
  _Invoker_type p_Stack_28;
  
  local_70.when.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
  local_40 = 0;
  uStack_38 = 0;
  local_70.what._M_invoker = fn->_M_invoker;
  local_70.what.super__Function_base._M_manager = (fn->super__Function_base)._M_manager;
  if (local_70.what.super__Function_base._M_manager == (_Manager_type)0x0) {
    local_70.what.super__Function_base._M_functor._M_unused._M_object = (void *)0x0;
    local_70.what.super__Function_base._M_functor._8_8_ = 0;
    local_70.what.super__Function_base._M_manager = (_Manager_type)0x0;
    p_Stack_28 = local_70.what._M_invoker;
  }
  else {
    local_40 = *(undefined8 *)&(fn->super__Function_base)._M_functor;
    uStack_38 = *(undefined8 *)((long)&(fn->super__Function_base)._M_functor + 8);
    (fn->super__Function_base)._M_manager = (_Manager_type)0x0;
    fn->_M_invoker = (_Invoker_type)0x0;
    local_70.what.super__Function_base._M_functor._M_unused._0_8_ =
         (undefined8)*(undefined8 *)&(fn->super__Function_base)._M_functor;
    local_70.what.super__Function_base._M_functor._8_8_ =
         *(undefined8 *)((long)&(fn->super__Function_base)._M_functor + 8);
    p_Stack_28 = (_Invoker_type)0x0;
  }
  local_30 = (code *)0x0;
  local_48 = (rep)local_70.when.__d.__r;
  std::vector<nrg::TimedExecution::QueueElement,_std::allocator<nrg::TimedExecution::QueueElement>_>
  ::emplace_back<nrg::TimedExecution::QueueElement>(&queue->c,&local_70);
  std::
  push_heap<__gnu_cxx::__normal_iterator<nrg::TimedExecution::QueueElement*,std::vector<nrg::TimedExecution::QueueElement,std::allocator<nrg::TimedExecution::QueueElement>>>,std::greater<nrg::TimedExecution::QueueElement>>
            ((queue->c).
             super__Vector_base<nrg::TimedExecution::QueueElement,_std::allocator<nrg::TimedExecution::QueueElement>_>
             ._M_impl.super__Vector_impl_data._M_start,
             (queue->c).
             super__Vector_base<nrg::TimedExecution::QueueElement,_std::allocator<nrg::TimedExecution::QueueElement>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  if (local_70.what.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_70.what.super__Function_base._M_manager)
              ((_Any_data *)&local_70.what,(_Any_data *)&local_70.what,__destroy_functor);
  }
  if (local_30 != (code *)0x0) {
    (*local_30)(&local_40,&local_40,3);
  }
  return;
}

Assistant:

static void push(Queue& queue, FN fn)
    {
        QueueElement elem = { now(), std::move(fn) };
        push(queue, std::move(elem));
    }